

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O0

void __thiscall
ProgramStreamDemuxer::ProgramStreamDemuxer
          (ProgramStreamDemuxer *this,BufferedReaderManager *readManager)

{
  BufferedReaderManager *this_00;
  int iVar1;
  char *streamName;
  AbstractReader *pAVar2;
  MemoryBlock *local_30;
  BufferedReaderManager *readManager_local;
  ProgramStreamDemuxer *this_local;
  
  AbstractDemuxer::AbstractDemuxer(&this->super_AbstractDemuxer);
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__ProgramStreamDemuxer_00442110;
  memset(this->m_tmpBuffer,0,0x3fa);
  this->m_readManager = readManager;
  this->m_dataProcessed = 0;
  std::__cxx11::string::string((string *)&this->m_streamName);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::map
            (&this->m_firstPtsTime);
  local_30 = this->m_lpcmWaveHeader;
  do {
    MemoryBlock::MemoryBlock(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (MemoryBlock *)this->m_lpcpHeaderAdded);
  this->m_psm_es_type[0xf0] = '\0';
  this->m_psm_es_type[0xf1] = '\0';
  this->m_psm_es_type[0xf2] = '\0';
  this->m_psm_es_type[0xf3] = '\0';
  this->m_psm_es_type[0xf4] = '\0';
  this->m_psm_es_type[0xf5] = '\0';
  this->m_psm_es_type[0xf6] = '\0';
  this->m_psm_es_type[0xf7] = '\0';
  this->m_psm_es_type[0xf8] = '\0';
  this->m_psm_es_type[0xf9] = '\0';
  this->m_psm_es_type[0xfa] = '\0';
  this->m_psm_es_type[0xfb] = '\0';
  this->m_psm_es_type[0xfc] = '\0';
  this->m_psm_es_type[0xfd] = '\0';
  this->m_psm_es_type[0xfe] = '\0';
  this->m_psm_es_type[0xff] = '\0';
  this->m_psm_es_type[0xe0] = '\0';
  this->m_psm_es_type[0xe1] = '\0';
  this->m_psm_es_type[0xe2] = '\0';
  this->m_psm_es_type[0xe3] = '\0';
  this->m_psm_es_type[0xe4] = '\0';
  this->m_psm_es_type[0xe5] = '\0';
  this->m_psm_es_type[0xe6] = '\0';
  this->m_psm_es_type[0xe7] = '\0';
  this->m_psm_es_type[0xe8] = '\0';
  this->m_psm_es_type[0xe9] = '\0';
  this->m_psm_es_type[0xea] = '\0';
  this->m_psm_es_type[0xeb] = '\0';
  this->m_psm_es_type[0xec] = '\0';
  this->m_psm_es_type[0xed] = '\0';
  this->m_psm_es_type[0xee] = '\0';
  this->m_psm_es_type[0xef] = '\0';
  this->m_psm_es_type[0xd0] = '\0';
  this->m_psm_es_type[0xd1] = '\0';
  this->m_psm_es_type[0xd2] = '\0';
  this->m_psm_es_type[0xd3] = '\0';
  this->m_psm_es_type[0xd4] = '\0';
  this->m_psm_es_type[0xd5] = '\0';
  this->m_psm_es_type[0xd6] = '\0';
  this->m_psm_es_type[0xd7] = '\0';
  this->m_psm_es_type[0xd8] = '\0';
  this->m_psm_es_type[0xd9] = '\0';
  this->m_psm_es_type[0xda] = '\0';
  this->m_psm_es_type[0xdb] = '\0';
  this->m_psm_es_type[0xdc] = '\0';
  this->m_psm_es_type[0xdd] = '\0';
  this->m_psm_es_type[0xde] = '\0';
  this->m_psm_es_type[0xdf] = '\0';
  this->m_psm_es_type[0xc0] = '\0';
  this->m_psm_es_type[0xc1] = '\0';
  this->m_psm_es_type[0xc2] = '\0';
  this->m_psm_es_type[0xc3] = '\0';
  this->m_psm_es_type[0xc4] = '\0';
  this->m_psm_es_type[0xc5] = '\0';
  this->m_psm_es_type[0xc6] = '\0';
  this->m_psm_es_type[199] = '\0';
  this->m_psm_es_type[200] = '\0';
  this->m_psm_es_type[0xc9] = '\0';
  this->m_psm_es_type[0xca] = '\0';
  this->m_psm_es_type[0xcb] = '\0';
  this->m_psm_es_type[0xcc] = '\0';
  this->m_psm_es_type[0xcd] = '\0';
  this->m_psm_es_type[0xce] = '\0';
  this->m_psm_es_type[0xcf] = '\0';
  this->m_psm_es_type[0xb0] = '\0';
  this->m_psm_es_type[0xb1] = '\0';
  this->m_psm_es_type[0xb2] = '\0';
  this->m_psm_es_type[0xb3] = '\0';
  this->m_psm_es_type[0xb4] = '\0';
  this->m_psm_es_type[0xb5] = '\0';
  this->m_psm_es_type[0xb6] = '\0';
  this->m_psm_es_type[0xb7] = '\0';
  this->m_psm_es_type[0xb8] = '\0';
  this->m_psm_es_type[0xb9] = '\0';
  this->m_psm_es_type[0xba] = '\0';
  this->m_psm_es_type[0xbb] = '\0';
  this->m_psm_es_type[0xbc] = '\0';
  this->m_psm_es_type[0xbd] = '\0';
  this->m_psm_es_type[0xbe] = '\0';
  this->m_psm_es_type[0xbf] = '\0';
  this->m_psm_es_type[0xa0] = '\0';
  this->m_psm_es_type[0xa1] = '\0';
  this->m_psm_es_type[0xa2] = '\0';
  this->m_psm_es_type[0xa3] = '\0';
  this->m_psm_es_type[0xa4] = '\0';
  this->m_psm_es_type[0xa5] = '\0';
  this->m_psm_es_type[0xa6] = '\0';
  this->m_psm_es_type[0xa7] = '\0';
  this->m_psm_es_type[0xa8] = '\0';
  this->m_psm_es_type[0xa9] = '\0';
  this->m_psm_es_type[0xaa] = '\0';
  this->m_psm_es_type[0xab] = '\0';
  this->m_psm_es_type[0xac] = '\0';
  this->m_psm_es_type[0xad] = '\0';
  this->m_psm_es_type[0xae] = '\0';
  this->m_psm_es_type[0xaf] = '\0';
  this->m_psm_es_type[0x90] = '\0';
  this->m_psm_es_type[0x91] = '\0';
  this->m_psm_es_type[0x92] = '\0';
  this->m_psm_es_type[0x93] = '\0';
  this->m_psm_es_type[0x94] = '\0';
  this->m_psm_es_type[0x95] = '\0';
  this->m_psm_es_type[0x96] = '\0';
  this->m_psm_es_type[0x97] = '\0';
  this->m_psm_es_type[0x98] = '\0';
  this->m_psm_es_type[0x99] = '\0';
  this->m_psm_es_type[0x9a] = '\0';
  this->m_psm_es_type[0x9b] = '\0';
  this->m_psm_es_type[0x9c] = '\0';
  this->m_psm_es_type[0x9d] = '\0';
  this->m_psm_es_type[0x9e] = '\0';
  this->m_psm_es_type[0x9f] = '\0';
  this->m_psm_es_type[0x80] = '\0';
  this->m_psm_es_type[0x81] = '\0';
  this->m_psm_es_type[0x82] = '\0';
  this->m_psm_es_type[0x83] = '\0';
  this->m_psm_es_type[0x84] = '\0';
  this->m_psm_es_type[0x85] = '\0';
  this->m_psm_es_type[0x86] = '\0';
  this->m_psm_es_type[0x87] = '\0';
  this->m_psm_es_type[0x88] = '\0';
  this->m_psm_es_type[0x89] = '\0';
  this->m_psm_es_type[0x8a] = '\0';
  this->m_psm_es_type[0x8b] = '\0';
  this->m_psm_es_type[0x8c] = '\0';
  this->m_psm_es_type[0x8d] = '\0';
  this->m_psm_es_type[0x8e] = '\0';
  this->m_psm_es_type[0x8f] = '\0';
  this->m_psm_es_type[0x70] = '\0';
  this->m_psm_es_type[0x71] = '\0';
  this->m_psm_es_type[0x72] = '\0';
  this->m_psm_es_type[0x73] = '\0';
  this->m_psm_es_type[0x74] = '\0';
  this->m_psm_es_type[0x75] = '\0';
  this->m_psm_es_type[0x76] = '\0';
  this->m_psm_es_type[0x77] = '\0';
  this->m_psm_es_type[0x78] = '\0';
  this->m_psm_es_type[0x79] = '\0';
  this->m_psm_es_type[0x7a] = '\0';
  this->m_psm_es_type[0x7b] = '\0';
  this->m_psm_es_type[0x7c] = '\0';
  this->m_psm_es_type[0x7d] = '\0';
  this->m_psm_es_type[0x7e] = '\0';
  this->m_psm_es_type[0x7f] = '\0';
  this->m_psm_es_type[0x60] = '\0';
  this->m_psm_es_type[0x61] = '\0';
  this->m_psm_es_type[0x62] = '\0';
  this->m_psm_es_type[99] = '\0';
  this->m_psm_es_type[100] = '\0';
  this->m_psm_es_type[0x65] = '\0';
  this->m_psm_es_type[0x66] = '\0';
  this->m_psm_es_type[0x67] = '\0';
  this->m_psm_es_type[0x68] = '\0';
  this->m_psm_es_type[0x69] = '\0';
  this->m_psm_es_type[0x6a] = '\0';
  this->m_psm_es_type[0x6b] = '\0';
  this->m_psm_es_type[0x6c] = '\0';
  this->m_psm_es_type[0x6d] = '\0';
  this->m_psm_es_type[0x6e] = '\0';
  this->m_psm_es_type[0x6f] = '\0';
  this->m_psm_es_type[0x50] = '\0';
  this->m_psm_es_type[0x51] = '\0';
  this->m_psm_es_type[0x52] = '\0';
  this->m_psm_es_type[0x53] = '\0';
  this->m_psm_es_type[0x54] = '\0';
  this->m_psm_es_type[0x55] = '\0';
  this->m_psm_es_type[0x56] = '\0';
  this->m_psm_es_type[0x57] = '\0';
  this->m_psm_es_type[0x58] = '\0';
  this->m_psm_es_type[0x59] = '\0';
  this->m_psm_es_type[0x5a] = '\0';
  this->m_psm_es_type[0x5b] = '\0';
  this->m_psm_es_type[0x5c] = '\0';
  this->m_psm_es_type[0x5d] = '\0';
  this->m_psm_es_type[0x5e] = '\0';
  this->m_psm_es_type[0x5f] = '\0';
  this->m_psm_es_type[0x40] = '\0';
  this->m_psm_es_type[0x41] = '\0';
  this->m_psm_es_type[0x42] = '\0';
  this->m_psm_es_type[0x43] = '\0';
  this->m_psm_es_type[0x44] = '\0';
  this->m_psm_es_type[0x45] = '\0';
  this->m_psm_es_type[0x46] = '\0';
  this->m_psm_es_type[0x47] = '\0';
  this->m_psm_es_type[0x48] = '\0';
  this->m_psm_es_type[0x49] = '\0';
  this->m_psm_es_type[0x4a] = '\0';
  this->m_psm_es_type[0x4b] = '\0';
  this->m_psm_es_type[0x4c] = '\0';
  this->m_psm_es_type[0x4d] = '\0';
  this->m_psm_es_type[0x4e] = '\0';
  this->m_psm_es_type[0x4f] = '\0';
  this->m_psm_es_type[0x30] = '\0';
  this->m_psm_es_type[0x31] = '\0';
  this->m_psm_es_type[0x32] = '\0';
  this->m_psm_es_type[0x33] = '\0';
  this->m_psm_es_type[0x34] = '\0';
  this->m_psm_es_type[0x35] = '\0';
  this->m_psm_es_type[0x36] = '\0';
  this->m_psm_es_type[0x37] = '\0';
  this->m_psm_es_type[0x38] = '\0';
  this->m_psm_es_type[0x39] = '\0';
  this->m_psm_es_type[0x3a] = '\0';
  this->m_psm_es_type[0x3b] = '\0';
  this->m_psm_es_type[0x3c] = '\0';
  this->m_psm_es_type[0x3d] = '\0';
  this->m_psm_es_type[0x3e] = '\0';
  this->m_psm_es_type[0x3f] = '\0';
  this->m_psm_es_type[0x20] = '\0';
  this->m_psm_es_type[0x21] = '\0';
  this->m_psm_es_type[0x22] = '\0';
  this->m_psm_es_type[0x23] = '\0';
  this->m_psm_es_type[0x24] = '\0';
  this->m_psm_es_type[0x25] = '\0';
  this->m_psm_es_type[0x26] = '\0';
  this->m_psm_es_type[0x27] = '\0';
  this->m_psm_es_type[0x28] = '\0';
  this->m_psm_es_type[0x29] = '\0';
  this->m_psm_es_type[0x2a] = '\0';
  this->m_psm_es_type[0x2b] = '\0';
  this->m_psm_es_type[0x2c] = '\0';
  this->m_psm_es_type[0x2d] = '\0';
  this->m_psm_es_type[0x2e] = '\0';
  this->m_psm_es_type[0x2f] = '\0';
  this->m_psm_es_type[0x10] = '\0';
  this->m_psm_es_type[0x11] = '\0';
  this->m_psm_es_type[0x12] = '\0';
  this->m_psm_es_type[0x13] = '\0';
  this->m_psm_es_type[0x14] = '\0';
  this->m_psm_es_type[0x15] = '\0';
  this->m_psm_es_type[0x16] = '\0';
  this->m_psm_es_type[0x17] = '\0';
  this->m_psm_es_type[0x18] = '\0';
  this->m_psm_es_type[0x19] = '\0';
  this->m_psm_es_type[0x1a] = '\0';
  this->m_psm_es_type[0x1b] = '\0';
  this->m_psm_es_type[0x1c] = '\0';
  this->m_psm_es_type[0x1d] = '\0';
  this->m_psm_es_type[0x1e] = '\0';
  this->m_psm_es_type[0x1f] = '\0';
  this->m_psm_es_type[0] = '\0';
  this->m_psm_es_type[1] = '\0';
  this->m_psm_es_type[2] = '\0';
  this->m_psm_es_type[3] = '\0';
  this->m_psm_es_type[4] = '\0';
  this->m_psm_es_type[5] = '\0';
  this->m_psm_es_type[6] = '\0';
  this->m_psm_es_type[7] = '\0';
  this->m_psm_es_type[8] = '\0';
  this->m_psm_es_type[9] = '\0';
  this->m_psm_es_type[10] = '\0';
  this->m_psm_es_type[0xb] = '\0';
  this->m_psm_es_type[0xc] = '\0';
  this->m_psm_es_type[0xd] = '\0';
  this->m_psm_es_type[0xe] = '\0';
  this->m_psm_es_type[0xf] = '\0';
  this->m_lpcpHeaderAdded[0] = false;
  this->m_lpcpHeaderAdded[1] = false;
  this->m_lpcpHeaderAdded[2] = false;
  this->m_lpcpHeaderAdded[3] = false;
  this->m_lpcpHeaderAdded[4] = false;
  this->m_lpcpHeaderAdded[5] = false;
  this->m_lpcpHeaderAdded[6] = false;
  this->m_lpcpHeaderAdded[7] = false;
  this->m_lpcpHeaderAdded[8] = false;
  this->m_lpcpHeaderAdded[9] = false;
  this->m_lpcpHeaderAdded[10] = false;
  this->m_lpcpHeaderAdded[0xb] = false;
  this->m_lpcpHeaderAdded[0xc] = false;
  this->m_lpcpHeaderAdded[0xd] = false;
  this->m_lpcpHeaderAdded[0xe] = false;
  this->m_lpcpHeaderAdded[0xf] = false;
  this_00 = this->m_readManager;
  streamName = (char *)std::__cxx11::string::c_str();
  pAVar2 = BufferedReaderManager::getReader(this_00,streamName);
  this->m_bufferedReader = pAVar2;
  iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[6])(this->m_bufferedReader,0x3fa);
  this->m_readerID = iVar1;
  this->m_lastReadRez = 0;
  this->m_lastPesLen = 0;
  this->m_lastPID = 0;
  this->m_tmpBufferLen = 0;
  this->m_firstPTS = -1;
  this->m_firstVideoPTS = -1;
  return;
}

Assistant:

ProgramStreamDemuxer::ProgramStreamDemuxer(const BufferedReaderManager& readManager)
    : m_tmpBuffer{}, m_readManager(readManager), m_dataProcessed(0)
{
    memset(m_psm_es_type, 0, sizeof(m_psm_es_type));
    memset(m_lpcpHeaderAdded, 0, sizeof(m_lpcpHeaderAdded));
    m_bufferedReader = m_readManager.getReader(m_streamName.c_str());
    m_readerID = m_bufferedReader->createReader(MAX_PES_HEADER_SIZE);
    m_lastReadRez = 0;
    m_lastPesLen = 0;
    m_lastPID = 0;
    m_tmpBufferLen = 0;
    m_firstPTS = -1;
    m_firstVideoPTS = -1;
}